

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueueTest.cpp
# Opt level: O0

TestType * __thiscall TestType::operator=(TestType *this,TestType *other)

{
  size_type sVar1;
  TestType *local_28;
  TestType *local_20;
  TestType *local_18;
  TestType *other_local;
  TestType *this_local;
  
  local_20 = this;
  local_18 = other;
  other_local = this;
  sVar1 = std::set<const_TestType_*,_std::less<const_TestType_*>,_std::allocator<const_TestType_*>_>
          ::count(&constructed,&local_20);
  if (sVar1 != 1) {
    __assert_fail("constructed.count(this) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x38,"TestType &TestType::operator=(TestType &&)");
  }
  local_28 = local_18;
  sVar1 = std::set<const_TestType_*,_std::less<const_TestType_*>,_std::allocator<const_TestType_*>_>
          ::count(&constructed,&local_28);
  if (sVar1 == 1) {
    return this;
  }
  __assert_fail("constructed.count(&other) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                ,0x39,"TestType &TestType::operator=(TestType &&)");
}

Assistant:

TestType &operator=(TestType &&other) noexcept {
    assert(constructed.count(this) == 1);
    assert(constructed.count(&other) == 1);
    return *this;
  }